

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_trcddi.cpp
# Opt level: O2

ze_result_t zeGetModuleProcAddrTable(ze_api_version_t version,ze_module_dditable_t *pDdiTable)

{
  ze_result_t zVar1;
  
  if (pDdiTable != (ze_module_dditable_t *)0x0) {
    zVar1 = ZE_RESULT_ERROR_UNSUPPORTED_VERSION;
    if (((tracing_layer::context ^ version) < ZE_API_VERSION_1_0) &&
       ((tracing_layer::context & 0xffff) <= (version & 0xffff))) {
      DAT_00189650 = pDdiTable->pfnCreate;
      DAT_00189658 = pDdiTable->pfnDestroy;
      pDdiTable->pfnCreate = tracing_layer::zeModuleCreate;
      pDdiTable->pfnDestroy = tracing_layer::zeModuleDestroy;
      DAT_00189660 = pDdiTable->pfnDynamicLink;
      DAT_00189668 = pDdiTable->pfnGetNativeBinary;
      pDdiTable->pfnDynamicLink = tracing_layer::zeModuleDynamicLink;
      pDdiTable->pfnGetNativeBinary = tracing_layer::zeModuleGetNativeBinary;
      DAT_00189670 = pDdiTable->pfnGetGlobalPointer;
      DAT_00189678 = pDdiTable->pfnGetKernelNames;
      pDdiTable->pfnGetGlobalPointer = tracing_layer::zeModuleGetGlobalPointer;
      pDdiTable->pfnGetKernelNames = tracing_layer::zeModuleGetKernelNames;
      DAT_00189680 = pDdiTable->pfnGetProperties;
      DAT_00189688 = pDdiTable->pfnGetFunctionPointer;
      pDdiTable->pfnGetProperties = tracing_layer::zeModuleGetProperties;
      pDdiTable->pfnGetFunctionPointer = tracing_layer::zeModuleGetFunctionPointer;
      DAT_00189690 = pDdiTable->pfnInspectLinkageExt;
      pDdiTable->pfnInspectLinkageExt = tracing_layer::zeModuleInspectLinkageExt;
      zVar1 = ZE_RESULT_SUCCESS;
    }
    return zVar1;
  }
  return ZE_RESULT_ERROR_INVALID_NULL_POINTER;
}

Assistant:

ZE_DLLEXPORT ze_result_t ZE_APICALL
zeGetModuleProcAddrTable(
    ze_api_version_t version,                       ///< [in] API version requested
    ze_module_dditable_t* pDdiTable                 ///< [in,out] pointer to table of DDI function pointers
    )
{
    auto& dditable = tracing_layer::context.zeDdiTable.Module;

    if( nullptr == pDdiTable )
        return ZE_RESULT_ERROR_INVALID_NULL_POINTER;

    if (ZE_MAJOR_VERSION(tracing_layer::context.version) != ZE_MAJOR_VERSION(version) ||
        ZE_MINOR_VERSION(tracing_layer::context.version) > ZE_MINOR_VERSION(version))
        return ZE_RESULT_ERROR_UNSUPPORTED_VERSION;

    ze_result_t result = ZE_RESULT_SUCCESS;

    dditable.pfnCreate                                   = pDdiTable->pfnCreate;
    pDdiTable->pfnCreate                                 = tracing_layer::zeModuleCreate;

    dditable.pfnDestroy                                  = pDdiTable->pfnDestroy;
    pDdiTable->pfnDestroy                                = tracing_layer::zeModuleDestroy;

    dditable.pfnDynamicLink                              = pDdiTable->pfnDynamicLink;
    pDdiTable->pfnDynamicLink                            = tracing_layer::zeModuleDynamicLink;

    dditable.pfnGetNativeBinary                          = pDdiTable->pfnGetNativeBinary;
    pDdiTable->pfnGetNativeBinary                        = tracing_layer::zeModuleGetNativeBinary;

    dditable.pfnGetGlobalPointer                         = pDdiTable->pfnGetGlobalPointer;
    pDdiTable->pfnGetGlobalPointer                       = tracing_layer::zeModuleGetGlobalPointer;

    dditable.pfnGetKernelNames                           = pDdiTable->pfnGetKernelNames;
    pDdiTable->pfnGetKernelNames                         = tracing_layer::zeModuleGetKernelNames;

    dditable.pfnGetProperties                            = pDdiTable->pfnGetProperties;
    pDdiTable->pfnGetProperties                          = tracing_layer::zeModuleGetProperties;

    dditable.pfnGetFunctionPointer                       = pDdiTable->pfnGetFunctionPointer;
    pDdiTable->pfnGetFunctionPointer                     = tracing_layer::zeModuleGetFunctionPointer;

    dditable.pfnInspectLinkageExt                        = pDdiTable->pfnInspectLinkageExt;
    pDdiTable->pfnInspectLinkageExt                      = tracing_layer::zeModuleInspectLinkageExt;

    return result;
}